

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::debugging_internal::ElfMemImage::LookupSymbolByAddress
          (ElfMemImage *this,void *address,SymbolInfo *info_out)

{
  bool bVar1;
  int iVar2;
  SymbolInfo *pSVar3;
  char *symbol_end;
  char *symbol_start;
  SymbolInfo *info;
  SymbolIterator __end2;
  SymbolIterator __begin2;
  ElfMemImage *__range2;
  SymbolInfo *info_out_local;
  void *address_local;
  ElfMemImage *this_local;
  
  begin((SymbolIterator *)&__end2.image_,this);
  end((SymbolIterator *)&info,this);
  do {
    bVar1 = SymbolIterator::operator!=((SymbolIterator *)&__end2.image_,(SymbolIterator *)&info);
    if (!bVar1) {
      return false;
    }
    pSVar3 = SymbolIterator::operator*((SymbolIterator *)&__end2.image_);
    if ((pSVar3->address <= address) &&
       (address < (void *)((long)pSVar3->address + pSVar3->symbol->st_size))) {
      if (info_out == (SymbolInfo *)0x0) {
        return true;
      }
      iVar2 = anon_unknown_1::ElfBind(pSVar3->symbol);
      if (iVar2 == 1) {
        info_out->name = pSVar3->name;
        info_out->version = pSVar3->version;
        info_out->address = pSVar3->address;
        info_out->symbol = pSVar3->symbol;
        return true;
      }
      info_out->name = pSVar3->name;
      info_out->version = pSVar3->version;
      info_out->address = pSVar3->address;
      info_out->symbol = pSVar3->symbol;
    }
    SymbolIterator::operator++((SymbolIterator *)&__end2.image_);
  } while( true );
}

Assistant:

bool ElfMemImage::LookupSymbolByAddress(const void *address,
                                        SymbolInfo *info_out) const {
  for (const SymbolInfo& info : *this) {
    const char *const symbol_start =
        reinterpret_cast<const char *>(info.address);
    const char *const symbol_end = symbol_start + info.symbol->st_size;
    if (symbol_start <= address && address < symbol_end) {
      if (info_out) {
        // Client wants to know details for that symbol (the usual case).
        if (ElfBind(info.symbol) == STB_GLOBAL) {
          // Strong symbol; just return it.
          *info_out = info;
          return true;
        } else {
          // Weak or local. Record it, but keep looking for a strong one.
          *info_out = info;
        }
      } else {
        // Client only cares if there is an overlapping symbol.
        return true;
      }
    }
  }
  return false;
}